

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LegalizeJSInterface.cpp
# Opt level: O1

void __thiscall
wasm::anon_unknown_0::LegalizeAndPruneJSInterface::run
          (LegalizeAndPruneJSInterface *this,Module *module)

{
  pointer puVar1;
  Export *pEVar2;
  Function *pFVar3;
  char *pcVar4;
  FeatureSet FVar5;
  mapped_type *pmVar6;
  size_type sVar7;
  Type *pTVar8;
  Expression *pEVar9;
  variant<wasm::Name,_wasm::HeapType> *__k;
  pointer puVar10;
  Module *pMVar11;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *exp;
  pointer puVar12;
  long lVar13;
  Type TVar14;
  pointer puVar15;
  undefined1 local_f0 [8];
  unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  exportedFunctions;
  Literal local_b0;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> local_98;
  size_type local_80;
  pointer local_78;
  MixedArena *local_70;
  undefined1 local_68 [8];
  Signature sig;
  Type local_48;
  Builder builder;
  Type local_38;
  
  LegalizeJSInterface::run(&this->super_LegalizeJSInterface,module);
  local_f0 = (undefined1  [8])&exportedFunctions._M_h._M_rehash_policy._M_next_resize;
  exportedFunctions._M_h._M_buckets = (__buckets_ptr)0x1;
  exportedFunctions._M_h._M_bucket_count = 0;
  exportedFunctions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  exportedFunctions._M_h._M_element_count._0_4_ = 0x3f800000;
  exportedFunctions._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  exportedFunctions._M_h._M_rehash_policy._4_4_ = 0;
  exportedFunctions._M_h._M_rehash_policy._M_next_resize = 0;
  puVar12 = (module->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (module->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar12 != puVar1) {
    do {
      pEVar2 = (puVar12->_M_t).
               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
               super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
      if (pEVar2->kind == Function) {
        if (*(__index_type *)
             ((long)&(pEVar2->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 0x10) == '\0'
           ) {
          __k = &pEVar2->value;
        }
        else {
          __k = (variant<wasm::Name,_wasm::HeapType> *)0x0;
        }
        pmVar6 = std::__detail::
                 _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)local_f0,(key_type *)__k);
        pcVar4 = *(char **)((long)&(pEVar2->name).super_IString + 8);
        (pmVar6->super_IString).str._M_len = *(size_t *)&(pEVar2->name).super_IString;
        (pmVar6->super_IString).str._M_str = pcVar4;
      }
      puVar12 = puVar12 + 1;
    } while (puVar12 != puVar1);
  }
  puVar10 = (module->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar15 = (module->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar10 != puVar15) {
    local_70 = &module->allocator;
    local_78 = puVar15;
    do {
      pFVar3 = (puVar10->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      pcVar4 = *(char **)((long)&(pFVar3->super_Importable).module + 8);
      sVar7 = std::
              _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::count((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_f0,(key_type *)pFVar3);
      if (pcVar4 != (char *)0x0 || sVar7 != 0) {
        local_80 = sVar7;
        _local_68 = HeapType::getSignature
                              (&((puVar10->_M_t).
                                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                 .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->type
                              );
        local_48 = local_68._8_8_;
        FVar5 = wasm::Type::getFeatures(&stack0xffffffffffffffb8);
        if ((FVar5.features & 0x248) == 0) {
          sig.results.id = wasm::Type::size((Type *)local_68);
          if ((long)sig.results.id >> 2 < 1) {
            pMVar11 = (Module *)0x0;
          }
          else {
            lVar13 = ((long)sig.results.id >> 2) + 1;
            pMVar11 = (Module *)0x0;
            do {
              local_48.id = (uintptr_t)local_68;
              builder.wasm = pMVar11;
              pTVar8 = wasm::Type::Iterator::operator*((Iterator *)&stack0xffffffffffffffb8);
              local_38.id = pTVar8->id;
              FVar5 = wasm::Type::getFeatures(&local_38);
              TVar14.id = (uintptr_t)pMVar11;
              if ((FVar5.features & 0x248) != 0) goto LAB_0092cf8e;
              TVar14.id = (long)&(pMVar11->exports).
                                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 1;
              local_48.id = (uintptr_t)local_68;
              builder.wasm = (Module *)TVar14.id;
              pTVar8 = wasm::Type::Iterator::operator*((Iterator *)&stack0xffffffffffffffb8);
              local_38.id = pTVar8->id;
              FVar5 = wasm::Type::getFeatures(&local_38);
              if ((FVar5.features & 0x248) != 0) goto LAB_0092cf8e;
              TVar14.id = (long)&(pMVar11->exports).
                                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 2;
              local_48.id = (uintptr_t)local_68;
              builder.wasm = (Module *)TVar14.id;
              pTVar8 = wasm::Type::Iterator::operator*((Iterator *)&stack0xffffffffffffffb8);
              local_38.id = pTVar8->id;
              FVar5 = wasm::Type::getFeatures(&local_38);
              if ((FVar5.features & 0x248) != 0) goto LAB_0092cf8e;
              TVar14.id = (long)&(pMVar11->exports).
                                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 3;
              local_48.id = (uintptr_t)local_68;
              builder.wasm = (Module *)TVar14.id;
              pTVar8 = wasm::Type::Iterator::operator*((Iterator *)&stack0xffffffffffffffb8);
              local_38.id = pTVar8->id;
              FVar5 = wasm::Type::getFeatures(&local_38);
              if ((FVar5.features & 0x248) != 0) goto LAB_0092cf8e;
              pMVar11 = (Module *)
                        ((long)&(pMVar11->exports).
                                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 4);
              lVar13 = lVar13 + -1;
            } while (1 < lVar13);
          }
          lVar13 = sig.results.id - (long)pMVar11;
          if (lVar13 == 1) {
LAB_0092cf5b:
            local_48.id = (uintptr_t)local_68;
            builder.wasm = pMVar11;
            pTVar8 = wasm::Type::Iterator::operator*((Iterator *)&stack0xffffffffffffffb8);
            local_38.id = pTVar8->id;
            FVar5 = wasm::Type::getFeatures(&local_38);
            TVar14.id = (uintptr_t)pMVar11;
            if ((FVar5.features & 0x248) == 0) {
LAB_0092cf8a:
              TVar14.id = sig.results.id;
            }
          }
          else if (lVar13 == 2) {
LAB_0092cf1e:
            local_48.id = (uintptr_t)local_68;
            builder.wasm = pMVar11;
            pTVar8 = wasm::Type::Iterator::operator*((Iterator *)&stack0xffffffffffffffb8);
            local_38.id = pTVar8->id;
            FVar5 = wasm::Type::getFeatures(&local_38);
            TVar14.id = (uintptr_t)pMVar11;
            if ((FVar5.features & 0x248) == 0) {
              pMVar11 = (Module *)
                        ((long)&(pMVar11->exports).
                                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 1);
              goto LAB_0092cf5b;
            }
          }
          else {
            if (lVar13 != 3) goto LAB_0092cf8a;
            local_48.id = (uintptr_t)local_68;
            builder.wasm = pMVar11;
            pTVar8 = wasm::Type::Iterator::operator*((Iterator *)&stack0xffffffffffffffb8);
            local_38.id = pTVar8->id;
            FVar5 = wasm::Type::getFeatures(&local_38);
            TVar14.id = (uintptr_t)pMVar11;
            if ((FVar5.features & 0x248) == 0) {
              pMVar11 = (Module *)
                        ((long)&(pMVar11->exports).
                                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 1);
              goto LAB_0092cf1e;
            }
          }
LAB_0092cf8e:
          puVar15 = local_78;
          if (TVar14.id == sig.results.id) goto LAB_0092d051;
        }
        sVar7 = local_80;
        if (pcVar4 != (char *)0x0) {
          pFVar3 = (puVar10->_M_t).
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
          (pFVar3->super_Importable).base.super_IString.str._M_len = 0;
          *(char **)((long)&(pFVar3->super_Importable).base + 8) = (char *)0x0;
          pFVar3 = (puVar10->_M_t).
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
          (pFVar3->super_Importable).module.super_IString.str._M_len = 0;
          *(char **)((long)&(pFVar3->super_Importable).module + 8) = (char *)0x0;
          local_48.id = (uintptr_t)module;
          if (sig.params.id == 0) {
            pEVar9 = (Expression *)MixedArena::allocSpace(local_70,0x10,8);
            pEVar9->_id = NopId;
            (pEVar9->type).id = 0;
            ((puVar10->_M_t).
             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
             super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->body = pEVar9;
          }
          else {
            Literal::makeZeros((Literals *)&exportedFunctions._M_h._M_single_bucket,sig.params);
            pEVar9 = Builder::makeConstantExpression
                               ((Builder *)&stack0xffffffffffffffb8,
                                (Literals *)&exportedFunctions._M_h._M_single_bucket);
            ((puVar10->_M_t).
             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
             super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->body = pEVar9;
            std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_98);
            Literal::~Literal(&local_b0);
          }
        }
        puVar15 = local_78;
        if (sVar7 != 0) {
          pmVar6 = std::__detail::
                   _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)local_f0,
                                (key_type *)
                                (puVar10->_M_t).
                                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
          Module::removeExport(module,(Name)(pmVar6->super_IString).str);
          puVar15 = local_78;
        }
      }
LAB_0092d051:
      puVar10 = puVar10 + 1;
    } while (puVar10 != puVar15);
  }
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_f0);
  return;
}

Assistant:

void run(Module* module) override {
    LegalizeJSInterface::run(module);

    prune(module);
  }